

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

WhereTerm *
whereScanInit(WhereScan *pScan,WhereClause *pWC,int iCur,int iColumn,u32 opMask,Index *pIdx)

{
  short sVar1;
  WhereTerm *pWVar2;
  uint uVar3;
  uint uVar4;
  
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  pScan->zCollName = (char *)0x0;
  pScan->pIdxExpr = (Expr *)0x0;
  pScan->idxaff = '\0';
  if (pIdx == (Index *)0x0) {
    uVar3 = iColumn;
    if (iColumn == -2) {
      return (WhereTerm *)0x0;
    }
  }
  else {
    sVar1 = pIdx->aiColumn[iColumn];
    uVar4 = (uint)sVar1;
    if (uVar4 == 0xfffffffe) {
      pScan->pIdxExpr = pIdx->aColExpr->a[iColumn].pExpr;
      uVar4 = 0xfffffffe;
    }
    else {
      uVar3 = 0xffffffff;
      if ((sVar1 == pIdx->pTable->iPKey) || (uVar3 = uVar4, sVar1 < 0)) goto LAB_0024a80d;
      pScan->idxaff = pIdx->pTable->aCol[uVar4].affinity;
    }
    pScan->zCollName = pIdx->azColl[iColumn];
    uVar3 = uVar4;
  }
LAB_0024a80d:
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aiCur[0] = iCur;
  pScan->aiColumn[0] = (i16)uVar3;
  pScan->nEquiv = '\x01';
  pScan->iEquiv = '\x01';
  pWVar2 = whereScanNext(pScan);
  return pWVar2;
}

Assistant:

static WhereTerm *whereScanInit(
  WhereScan *pScan,       /* The WhereScan object being initialized */
  WhereClause *pWC,       /* The WHERE clause to be scanned */
  int iCur,               /* Cursor to scan for */
  int iColumn,            /* Column to scan for */
  u32 opMask,             /* Operator(s) to scan for */
  Index *pIdx             /* Must be compatible with this index */
){
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  pScan->pIdxExpr = 0;
  pScan->idxaff = 0;
  pScan->zCollName = 0;
  if( pIdx ){
    int j = iColumn;
    iColumn = pIdx->aiColumn[j];
    if( iColumn==XN_EXPR ){
      pScan->pIdxExpr = pIdx->aColExpr->a[j].pExpr;
      pScan->zCollName = pIdx->azColl[j];
    }else if( iColumn==pIdx->pTable->iPKey ){
      iColumn = XN_ROWID;
    }else if( iColumn>=0 ){
      pScan->idxaff = pIdx->pTable->aCol[iColumn].affinity;
      pScan->zCollName = pIdx->azColl[j];
    }
  }else if( iColumn==XN_EXPR ){
    return 0;
  }
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aiCur[0] = iCur;
  pScan->aiColumn[0] = iColumn;
  pScan->nEquiv = 1;
  pScan->iEquiv = 1;
  return whereScanNext(pScan);
}